

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O3

void __thiscall
foxxll::linuxaio_queue::handle_events
          (linuxaio_queue *this,io_event *events,long num_events,bool canceled)

{
  long *plVar1;
  long lVar2;
  
  tlx::Semaphore::signal(&this->num_free_events_,(int)num_events,(__sighandler_t)num_events);
  lVar2 = num_events;
  if (0 < num_events) {
    do {
      plVar1 = (long *)events->data;
      (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0x68)) + 0x18))
                (*(long *)(*plVar1 + -0x68) + (long)plVar1,canceled);
      if (plVar1[1] == 0) {
        __assert_fail("reference_count_ > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/extlib/tlx/tlx/counting_ptr.hpp"
                      ,0x177,"bool tlx::ReferenceCounter::dec_reference() const");
      }
      LOCK();
      plVar1[1] = plVar1[1] + -1;
      UNLOCK();
      events = events + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  tlx::Semaphore::wait(&this->num_posted_requests_,(void *)num_events);
  return;
}

Assistant:

void linuxaio_queue::handle_events(io_event* events, long num_events, bool canceled)
{
    // first mark all events as free
    num_free_events_.signal(num_events);

    for (int e = 0; e < num_events; ++e)
    {
        request* r = reinterpret_cast<request*>(
                static_cast<uintptr_t>(events[e].data));
        r->completed(canceled);
        // release counting_ptr reference, this may delete the request object
        r->dec_reference();
    }

    num_posted_requests_.wait(num_events); // will never block
}